

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_buffer_size_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  long lVar1;
  size_type sVar2;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  
  CompilerGLSL::to_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,id,true);
  lVar1 = ::std::__cxx11::string::find((char)&expr,0x5b);
  if (((2 < expr._M_string_length) && (*expr._M_dataplus._M_p == '(')) &&
     (expr._M_dataplus._M_p[1] == '*')) {
    CompilerGLSL::address_of_expression(&buffer_expr,&this->super_CompilerGLSL,&expr);
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&buffer_expr);
    ::std::__cxx11::string::~string((string *)&buffer_expr);
  }
  for (sVar2 = 0; expr._M_string_length != sVar2; sVar2 = sVar2 + 1) {
    if (expr._M_dataplus._M_p[sVar2] == '.') {
      expr._M_dataplus._M_p[sVar2] = '_';
    }
  }
  if (lVar1 == -1) {
    ::std::operator+(__return_storage_ptr__,&expr,&this->buffer_size_name_suffix);
  }
  else {
    ::std::__cxx11::string::substr((ulong)&buffer_expr,(ulong)&expr);
    ::std::__cxx11::string::substr((ulong)&array_expr,(ulong)&expr);
    ::std::operator+(&local_68,&buffer_expr,&this->buffer_size_name_suffix);
    ::std::operator+(__return_storage_ptr__,&local_68,&array_expr);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&array_expr);
    ::std::__cxx11::string::~string((string *)&buffer_expr);
  }
  ::std::__cxx11::string::~string((string *)&expr);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_buffer_size_expression(uint32_t id)
{
	auto expr = to_expression(id);
	auto index = expr.find_first_of('[');

	// This is quite crude, but we need to translate the reference name (*spvDescriptorSetN.name) to
	// the pointer expression spvDescriptorSetN.name to make a reasonable expression here.
	// This only happens if we have argument buffers and we are using OpArrayLength on a lone SSBO in that set.
	if (expr.size() >= 3 && expr[0] == '(' && expr[1] == '*')
		expr = address_of_expression(expr);

	// If a buffer is part of an argument buffer translate this to a legal identifier.
	for (auto &c : expr)
		if (c == '.')
			c = '_';

	if (index == string::npos)
		return expr + buffer_size_name_suffix;
	else
	{
		auto buffer_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return buffer_expr + buffer_size_name_suffix + array_expr;
	}
}